

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_surf.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_15::MthdSurfFormat::emulate_mthd(MthdSurfFormat *this)

{
  uint uVar1;
  uint32_t local_20;
  int fmt;
  int which_1;
  int f;
  int which;
  MthdSurfFormat *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type < 4) {
    uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                           ctx_switch_a << 0x2e) >> 0x3e);
    fmt = (int)(-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3f));
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2f)) {
      fmt = 2;
    }
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x27)) {
      fmt = 3;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format &
         ((uint)(7L << (sbyte)(uVar1 << 2)) ^ 0xffffffff) |
         (uint)((long)(int)(fmt | 4) << (sbyte)(uVar1 << 2));
  }
  else {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.cls & 3;
    local_20 = 0;
    if ((this->super_SingleMthdTest).super_MthdTest.val == 1) {
      if ((uVar1 == 3) &&
         (0x1f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                 super_Test.chipset.card_type)) {
        local_20 = 2;
      }
      else {
        local_20 = 7;
      }
    }
    else if ((this->super_SingleMthdTest).super_MthdTest.val == 0x1010000) {
      local_20 = 1;
    }
    else if ((this->super_SingleMthdTest).super_MthdTest.val == 0x1000000) {
      if ((uVar1 == 3) &&
         (0x1f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                 super_Test.chipset.card_type)) {
        local_20 = 1;
      }
      else {
        local_20 = 2;
      }
    }
    else if ((this->super_SingleMthdTest).super_MthdTest.val == 0x1010001) {
      if ((uVar1 == 3) &&
         (0x1f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                 super_Test.chipset.card_type)) {
        local_20 = 1;
      }
      else {
        local_20 = 6;
      }
    }
    pgraph_set_surf_format
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,uVar1,local_20);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			int which = extr(exp.ctx_switch_a, 16, 2);
			int f = 1;
			if (extr(val, 0, 1))
				f = 0;
			if (!extr(val, 16, 1))
				f = 2;
			if (!extr(val, 24, 1))
				f = 3;
			insrt(exp.surf_format, 4*which, 3, f | 4);
		} else {
			int which = cls & 3;
			int fmt = 0;
			if (val == 1) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 2;
				else
					fmt = 7;
			} else if (val == 0x01010000) {
				fmt = 1;
			} else if (val == 0x01000000) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 1;
				else
					fmt = 2;
			} else if (val == 0x01010001) {
				if (which == 3 && chipset.card_type >= 0x20)
					fmt = 1;
				else
					fmt = 6;
			}
			pgraph_set_surf_format(&exp, which, fmt);
		}
	}